

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

void __thiscall
rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients(Polynomial<double> *this)

{
  bool bVar1;
  reference pcVar2;
  size_type sVar3;
  double dVar4;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_88;
  const_iterator local_80;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_60 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  complex<double> c;
  iterator __end0;
  iterator __begin0;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range2;
  Complex sum;
  Polynomial<double> *this_local;
  
  sum._M_value._8_8_ = this;
  std::complex<double>::complex((complex<double> *)&__range2,0.0,0.0);
  __end0 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                     (&this->coefficients_);
  c._M_value._8_8_ =
       std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                 (&this->coefficients_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                                     *)(c._M_value + 8)), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&__end0);
    it.current._M_current =
         *(__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
           *)pcVar2->_M_value;
    c._M_value._0_8_ = *(undefined8 *)(pcVar2->_M_value + 8);
    std::complex<double>::operator+=((complex<double> *)&__range2,(complex<double> *)&it);
    __gnu_cxx::
    __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
    ::operator++(&__end0);
  }
  sVar3 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                    (&this->coefficients_);
  if (1 < sVar3) {
    dVar4 = std::abs<double>((complex<double> *)&__range2);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::rbegin
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 (local_60 + 8));
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::rend
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_60);
      std::
      find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients()::_lambda(std::complex<double>)_1_>
                (&local_50,local_60 + 8,local_60);
      local_78._M_current =
           (complex<double> *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           ::base(&local_50);
      __gnu_cxx::
      __normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
      ::__normal_iterator<std::complex<double>*>
                ((__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                  *)&local_70,&local_78);
      local_88._M_current =
           (complex<double> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                     (&this->coefficients_);
      __gnu_cxx::
      __normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
      ::__normal_iterator<std::complex<double>*>
                ((__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                  *)&local_80,&local_88);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::erase
                (&this->coefficients_,local_70,local_80);
    }
  }
  updateOrderAndSize(this);
  return;
}

Assistant:

void Polynomial<T>::removeHighOrderZeroCoefficients() {

            Complex sum(0);
            for (auto c : coefficients_)
                sum += c;

            if (coefficients_.size() > 1 && std::abs(sum) != 0) {
                auto it = std::find_if(coefficients_.rbegin(), coefficients_.rend(), [](Complex v){ return std::abs(v) != 0;      });
                coefficients_.erase(it.base(), coefficients_.end());
            }
            updateOrderAndSize();
        }